

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_utils.cpp
# Opt level: O2

void * zmq_threadstart(undefined1 *func_,void *arg_)

{
  thread_t *this;
  
  this = (thread_t *)operator_new(0x68,(nothrow_t *)&std::nothrow);
  if (this == (thread_t *)0x0) {
    fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmq_utils.cpp"
            ,0x56);
    fflush(_stderr);
    zmq::zmq_abort("FATAL ERROR: OUT OF MEMORY");
  }
  else {
    zmq::thread_t::thread_t(this);
  }
  zmq::thread_t::start(this,(thread_fn *)func_,arg_,"ZMQapp");
  return this;
}

Assistant:

void *zmq_threadstart (zmq_thread_fn *func_, void *arg_)
{
    zmq::thread_t *thread = new (std::nothrow) zmq::thread_t;
    alloc_assert (thread);
    thread->start (func_, arg_, "ZMQapp");
    return thread;
}